

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VSetArrayPointer(N_Vector W,sunindextype local_length,int myid)

{
  int iVar1;
  void *__ptr;
  uint in_EDX;
  long in_RSI;
  N_Vector in_RDI;
  double dVar2;
  double dVar3;
  sunrealtype *Wdata;
  double maxt;
  double stop_time;
  double start_time;
  sunindextype i;
  int failure;
  long local_28;
  int local_20;
  int local_4;
  
  local_20 = 0;
  if (in_RDI->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d missing required operations\n",
           (ulong)in_EDX);
    local_4 = 1;
  }
  else {
    __ptr = malloc(in_RSI << 3);
    for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
      *(undefined8 *)((long)__ptr + local_28 * 8) = 0x3ff0000000000000;
    }
    dVar2 = get_time();
    N_VSetArrayPointer(__ptr,in_RDI);
    dVar3 = get_time();
    N_VConst(0xbfe0000000000000,in_RDI);
    for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
      iVar1 = SUNRCompare(*(undefined8 *)((long)__ptr + local_28 * 8),0xbfe0000000000000);
      local_20 = iVar1 + local_20;
    }
    if (local_20 == 0) {
      free(__ptr);
      if (in_EDX == 0) {
        printf("PASSED test -- N_VSetArrayPointer \n");
      }
      dVar2 = max_time(in_RDI,dVar3 - dVar2);
      if (print_time != 0) {
        printf("%s Time: %22.15e\n\n",dVar2,"N_VSetArrayPointer");
      }
      local_4 = 0;
    }
    else {
      printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d \n",(ulong)in_EDX);
      printf("    Failed N_VConst check \n\n");
      free(__ptr);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int Test_N_VSetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int failure = 0;
  sunindextype i;
  double start_time, stop_time, maxt;
  sunrealtype* Wdata;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d missing required "
           "operations\n",
           myid);
    return (1);
  }

  /* create vector data */
  Wdata = (sunrealtype*)malloc(local_length * sizeof(sunrealtype));
  for (i = 0; i < local_length; i++) { Wdata[i] = ONE; }

  /* attach data to vector */
  start_time = get_time();
  N_VSetArrayPointer(Wdata, W);
  stop_time = get_time();

  /* check vector data */
  N_VConst(NEG_HALF, W);
  for (i = 0; i < local_length; i++)
  {
    failure += SUNRCompare(Wdata[i], NEG_HALF);
  }

  if (failure)
  {
    printf(">>> FAILED test -- N_VSetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    free(Wdata);
    return (1);
  }

  free(Wdata);

  if (myid == 0) { printf("PASSED test -- N_VSetArrayPointer \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VSetArrayPointer", maxt);

  return (0);
}